

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

char * ures_getLocaleByType_63
                 (UResourceBundle *resourceBundle,ULocDataLocaleType type,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  ULocDataLocaleType type_local;
  UResourceBundle *resourceBundle_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resourceBundle_local = (UResourceBundle *)0x0;
  }
  else if (resourceBundle == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    resourceBundle_local = (UResourceBundle *)0x0;
  }
  else if (type == ULOC_ACTUAL_LOCALE) {
    resourceBundle_local = (UResourceBundle *)resourceBundle->fData->fName;
  }
  else if (type == ULOC_VALID_LOCALE) {
    resourceBundle_local = (UResourceBundle *)resourceBundle->fTopLevelData->fName;
  }
  else {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    resourceBundle_local = (UResourceBundle *)0x0;
  }
  return (char *)resourceBundle_local;
}

Assistant:

U_CAPI const char* U_EXPORT2 
ures_getLocaleByType(const UResourceBundle* resourceBundle, 
                     ULocDataLocaleType type, 
                     UErrorCode* status) {
    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if (!resourceBundle) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    } else {
        switch(type) {
        case ULOC_ACTUAL_LOCALE:
            return resourceBundle->fData->fName;
        case ULOC_VALID_LOCALE:
            return resourceBundle->fTopLevelData->fName;
        case ULOC_REQUESTED_LOCALE:
        default:
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return NULL;
        }
    }
}